

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.hpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
Splay::queryLower(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Splay *this,
                 double x)

{
  Node *pNVar1;
  pair<Node_*,_bool> pVar2;
  allocator_type local_21;
  value_type_conflict local_20;
  
  if (this->rt == (Node *)0x0) {
LAB_001063a8:
    local_20 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,(long)this->momentN + 1,&local_20,&local_21);
  }
  else {
    pVar2 = nextX(this,this->rt,x);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pNVar1 = this->rt;
    }
    else {
      splay(this,pVar2.first,(Node *)0x0);
      pNVar1 = (pVar2.first)->ch[0];
      if (pNVar1 == (Node *)0x0) goto LAB_001063a8;
    }
    std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,&pNVar1->moments);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> queryLower(double x) {
        if (rt == nullptr) {
            return vector<double>(momentN + 1, 0.0);
        }
        pair<Node *, bool> nxt = nextX(rt, x);
        if (!nxt.second) {
            return rt->moments;
        }
        Node *nxtp = nxt.first;
        splay(nxtp);
        if (nxtp->ch[0]) {
            return nxtp->ch[0]->moments;
        } else {
            return vector<double>(momentN + 1, 0.0);
        }
    }